

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall IRT::ChildrenAnswers::PushBack(ChildrenAnswers *this,string *description,int id)

{
  int local_1c;
  string *psStack_18;
  int id_local;
  string *description_local;
  ChildrenAnswers *this_local;
  
  local_1c = id;
  psStack_18 = description;
  description_local = (string *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->descriptions,description);
  std::vector<int,_std::allocator<int>_>::push_back(&this->ids,&local_1c);
  return;
}

Assistant:

void IRT::ChildrenAnswers::PushBack( std::string description, int id ) {
    this->descriptions.push_back( description );
    this->ids.push_back( id );
}